

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.h
# Opt level: O3

char __thiscall wasm::SourceMapReader::peek(SourceMapReader *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  string *psVar4;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  uVar1 = this->pos;
  cVar3 = '\"';
  uVar2 = (this->mappings)._M_len;
  if (uVar1 != uVar2) {
    if (uVar2 < uVar1) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"unexpected end of source map","");
      *(string **)psVar4 = psVar4 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar4,local_48,local_48 + local_40);
      __cxa_throw(psVar4,&MapParseException::typeinfo,MapParseException::~MapParseException);
    }
    cVar3 = (this->mappings)._M_str[uVar1];
  }
  return cVar3;
}

Assistant:

char peek() {
    if (pos == mappings.size()) {
      return '"';
    } else if (pos > mappings.size()) {
      throw MapParseException("unexpected end of source map");
    }
    return mappings[pos];
  }